

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotatedPagesPDF.cpp
# Opt level: O0

int RotatedPagesPDF(int argc,char **argv)

{
  IByteWriter *pIVar1;
  int iVar2;
  EncryptionOptions *pEVar3;
  PDFUsedFont *inFont;
  BoolAndInt *pBVar4;
  PageContentContext *this;
  LogConfiguration *inLogConfiguration;
  PDFParsingOptions *pPVar5;
  IByteReaderWithPosition *inSourceStream;
  unsigned_long uVar6;
  ostream *poVar7;
  PDFDictionary *pPVar8;
  bool bVar9;
  undefined1 local_1df0 [8];
  PDFPageInput input;
  RefCountPtr<PDFDictionary> page_1;
  unsigned_long i_1;
  string local_1db8;
  string local_1d98;
  undefined1 local_1d78 [8];
  PDFParser pdfParser;
  InputFile pdfFile;
  PDFPageRange local_16d8;
  allocator<char> local_16b1;
  string local_16b0;
  string local_1690;
  EStatusCodeAndObjectIDTypeList local_1670;
  undefined1 local_1650 [8];
  EStatusCodeAndObjectIDTypeList result;
  PDFCreationSettings local_15e0;
  allocator<char> local_1579;
  string local_1578;
  string local_1558;
  string local_1538;
  PageContentContext *local_1518;
  PageContentContext *cxt;
  ostringstream s;
  PDFRectangle local_1398;
  undefined1 local_1378 [8];
  PDFPage page;
  int i;
  string local_1098;
  undefined1 local_1078 [8];
  TextOptions textOptions;
  EncryptionOptions local_1048;
  PDFCreationSettings local_ff8;
  allocator<char> local_f91;
  string local_f90;
  string local_f70;
  undefined1 local_f50 [8];
  PDFWriter pdfWriter;
  EStatusCode status;
  allocator<char> local_89;
  string local_88;
  string local_68;
  undefined1 local_48 [8];
  LogConfiguration logConfiguration;
  char **argv_local;
  int argc_local;
  
  logConfiguration.LogStream = (IByteWriter *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"RotatedPagesLog.txt",&local_89);
  BuildRelativeOutputPath(&local_68,argv,&local_88);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_48,true,true,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  PDFWriter::PDFWriter((PDFWriter *)local_f50);
  pIVar1 = logConfiguration.LogStream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f90,"RotatedPages.pdf",&local_f91);
  BuildRelativeOutputPath(&local_f70,(char **)pIVar1,&local_f90);
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_1048,pEVar3);
  PDFCreationSettings::PDFCreationSettings(&local_ff8,true,true,&local_1048,false);
  pdfWriter.mModifiedFileVersion =
       PDFWriter::StartPDF((PDFWriter *)local_f50,&local_f70,ePDFVersion13,
                           (LogConfiguration *)local_48,&local_ff8);
  PDFCreationSettings::~PDFCreationSettings(&local_ff8);
  EncryptionOptions::~EncryptionOptions(&local_1048);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f90);
  std::allocator<char>::~allocator(&local_f91);
  pIVar1 = logConfiguration.LogStream;
  if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"fonts/arial.ttf",(allocator<char> *)((long)&page.mContentContext + 7));
    BuildRelativeInputPath(&local_1098,(char **)pIVar1,(string *)&i);
    inFont = PDFWriter::GetFontForFile((PDFWriter *)local_f50,&local_1098,0);
    AbstractContentContext::TextOptions::TextOptions
              ((TextOptions *)local_1078,inFont,14.0,eGray,0,255.0);
    std::__cxx11::string::~string((string *)&local_1098);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)((long)&page.mContentContext + 7));
    for (page.mContentContext._0_4_ = 0;
        (int)page.mContentContext < 6 && pdfWriter.mModifiedFileVersion == ePDFVersionUndefined;
        page.mContentContext._0_4_ = (int)page.mContentContext + 1) {
      PDFPage::PDFPage((PDFPage *)local_1378);
      PDFRectangle::PDFRectangle(&local_1398,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox((PDFPage *)local_1378,&local_1398);
      PDFRectangle::~PDFRectangle(&local_1398);
      std::operator<<((ostream *)&std::cout,"Setting invalid rotation to 33\n");
      PDFPage::SetRotate((PDFPage *)local_1378,0x21);
      pBVar4 = PDFPage::GetRotate((PDFPage *)local_1378);
      if (pBVar4->second == 0) {
        std::operator<<((ostream *)&std::cout,"success in failing to apply invalid rotation\n");
        PDFPage::SetRotate((PDFPage *)local_1378,(int)page.mContentContext * 0x5a);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cxt);
        poVar7 = std::operator<<((ostream *)&cxt,"Page rotated by ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)page.mContentContext * 0x5a);
        std::operator<<(poVar7," degrees.");
        this = PDFWriter::StartPageContentContext((PDFWriter *)local_f50,(PDFPage *)local_1378);
        local_1518 = this;
        std::__cxx11::ostringstream::str();
        AbstractContentContext::WriteText
                  (&this->super_AbstractContentContext,75.0,805.0,&local_1538,
                   (TextOptions *)local_1078);
        std::__cxx11::string::~string((string *)&local_1538);
        pdfWriter.mModifiedFileVersion =
             PDFWriter::EndPageContentContext((PDFWriter *)local_f50,local_1518);
        if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
          pdfWriter.mModifiedFileVersion =
               PDFWriter::WritePage((PDFWriter *)local_f50,(PDFPage *)local_1378);
          if (pdfWriter.mModifiedFileVersion != ePDFVersionUndefined) {
            poVar7 = std::operator<<((ostream *)&std::cout,"failed to write page ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)page.mContentContext);
            std::operator<<(poVar7,"\n");
          }
          textOptions.opacity._4_4_ = 0;
        }
        else {
          pdfWriter.mModifiedFileVersion = ~ePDFVersionUndefined;
          std::operator<<((ostream *)&std::cout,"Failed to end content context\n");
          textOptions.opacity._4_4_ = 4;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cxt);
      }
      else {
        pdfWriter.mModifiedFileVersion = ~ePDFVersionUndefined;
        std::operator<<((ostream *)&std::cout,"Failed to reject invalid rotation\n");
        textOptions.opacity._4_4_ = 4;
      }
      PDFPage::~PDFPage((PDFPage *)local_1378);
      if (textOptions.opacity._4_4_ != 0) break;
    }
    pdfWriter.mModifiedFileVersion = PDFWriter::EndPDF((PDFWriter *)local_f50);
    pIVar1 = logConfiguration.LogStream;
    if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1578,"RotatedPagesCopy.pdf",&local_1579);
      BuildRelativeOutputPath(&local_1558,(char **)pIVar1,&local_1578);
      inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
      pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
      EncryptionOptions::EncryptionOptions
                ((EncryptionOptions *)
                 &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl._M_node._M_size,pEVar3);
      PDFCreationSettings::PDFCreationSettings
                (&local_15e0,true,true,
                 (EncryptionOptions *)
                 &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl._M_node._M_size,false);
      pdfWriter.mModifiedFileVersion =
           PDFWriter::StartPDF((PDFWriter *)local_f50,&local_1558,ePDFVersion13,inLogConfiguration,
                               &local_15e0);
      PDFCreationSettings::~PDFCreationSettings(&local_15e0);
      EncryptionOptions::~EncryptionOptions
                ((EncryptionOptions *)
                 &result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl._M_node._M_size);
      std::__cxx11::string::~string((string *)&local_1558);
      std::__cxx11::string::~string((string *)&local_1578);
      std::allocator<char>::~allocator(&local_1579);
      if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
        std::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_true>
                  ((pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)local_1650);
        pIVar1 = logConfiguration.LogStream;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_16b0,"RotatedPages.pdf",&local_16b1);
        BuildRelativeOutputPath(&local_1690,(char **)pIVar1,&local_16b0);
        PDFPageRange::PDFPageRange(&local_16d8);
        pdfFile.mFileStream = (InputFileStream *)0x0;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&pdfFile.mFileStream);
        pPVar5 = PDFParsingOptions::DefaultPDFParsingOptions();
        PDFWriter::AppendPDFPagesFromPDF
                  (&local_1670,(PDFWriter *)local_f50,&local_1690,&local_16d8,
                   (ObjectIDTypeList *)&pdfFile.mFileStream,pPVar5);
        std::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator=((pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)local_1650,&local_1670);
        std::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair(&local_1670);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&pdfFile.mFileStream);
        PDFPageRange::~PDFPageRange(&local_16d8);
        std::__cxx11::string::~string((string *)&local_1690);
        std::__cxx11::string::~string((string *)&local_16b0);
        std::allocator<char>::~allocator(&local_16b1);
        if (local_1650._0_4_ == ePDFVersionUndefined) {
          pdfWriter.mModifiedFileVersion = PDFWriter::EndPDF((PDFWriter *)local_f50);
          if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
            InputFile::InputFile((InputFile *)&pdfParser.mAllowExtendingSegments);
            PDFParser::PDFParser((PDFParser *)local_1d78);
            pIVar1 = logConfiguration.LogStream;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1db8,"RotatedPagesCopy.pdf",
                       (allocator<char> *)((long)&i_1 + 7));
            BuildRelativeOutputPath(&local_1d98,(char **)pIVar1,&local_1db8);
            pdfWriter.mModifiedFileVersion =
                 InputFile::OpenFile((InputFile *)&pdfParser.mAllowExtendingSegments,&local_1d98);
            std::__cxx11::string::~string((string *)&local_1d98);
            std::__cxx11::string::~string((string *)&local_1db8);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
            if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
              inSourceStream =
                   InputFile::GetInputStream((InputFile *)&pdfParser.mAllowExtendingSegments);
              pPVar5 = PDFParsingOptions::DefaultPDFParsingOptions();
              pdfWriter.mModifiedFileVersion =
                   PDFParser::StartPDFParsing((PDFParser *)local_1d78,inSourceStream,pPVar5);
              if (pdfWriter.mModifiedFileVersion == ePDFVersionUndefined) {
                uVar6 = PDFParser::GetPagesCount((PDFParser *)local_1d78);
                if (uVar6 == 6) {
                  for (page_1.mValue = (PDFDictionary *)0x0;
                      pPVar8 = (PDFDictionary *)PDFParser::GetPagesCount((PDFParser *)local_1d78),
                      page_1.mValue < pPVar8 &&
                      pdfWriter.mModifiedFileVersion == ePDFVersionUndefined;
                      page_1.mValue =
                           (PDFDictionary *)
                           ((long)&((page_1.mValue)->super_PDFObject).super_RefCountObject.
                                   _vptr_RefCountObject + 1)) {
                    pPVar8 = PDFParser::ParsePage
                                       ((PDFParser *)local_1d78,(unsigned_long)page_1.mValue);
                    RefCountPtr<PDFDictionary>::RefCountPtr
                              ((RefCountPtr<PDFDictionary> *)
                               &input.mPageObject.super_RefCountPtr<PDFDictionary>.mValue,pPVar8);
                    bVar9 = RefCountPtr<PDFDictionary>::operator!
                                      ((RefCountPtr<PDFDictionary> *)
                                       &input.mPageObject.super_RefCountPtr<PDFDictionary>.mValue);
                    if (bVar9) {
                      poVar7 = (ostream *)
                               std::ostream::operator<<((ostream *)&std::cout,(ulong)page_1.mValue);
                      std::operator<<(poVar7,". page parsing failed\n");
                      pdfWriter.mModifiedFileVersion = ~ePDFVersionUndefined;
                      textOptions.opacity._4_4_ = 7;
                    }
                    else {
                      PDFPageInput::PDFPageInput
                                ((PDFPageInput *)local_1df0,(PDFParser *)local_1d78,
                                 (RefCountPtr<PDFDictionary> *)
                                 &input.mPageObject.super_RefCountPtr<PDFDictionary>.mValue);
                      iVar2 = PDFPageInput::GetRotate((PDFPageInput *)local_1df0);
                      if ((long)iVar2 == (long)page_1.mValue * 0x5a) {
                        textOptions.opacity._4_4_ = 0;
                      }
                      else {
                        poVar7 = (ostream *)
                                 std::ostream::operator<<
                                           ((ostream *)&std::cout,(ulong)page_1.mValue);
                        std::operator<<(poVar7,". page has invalid rotation\n");
                        pdfWriter.mModifiedFileVersion = ~ePDFVersionUndefined;
                        textOptions.opacity._4_4_ = 7;
                      }
                      PDFPageInput::~PDFPageInput((PDFPageInput *)local_1df0);
                    }
                    RefCountPtr<PDFDictionary>::~RefCountPtr
                              ((RefCountPtr<PDFDictionary> *)
                               &input.mPageObject.super_RefCountPtr<PDFDictionary>.mValue);
                    if (textOptions.opacity._4_4_ != 0) break;
                  }
                  textOptions.opacity._4_4_ = 0;
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cout,"expecting 6 pages, got ");
                  uVar6 = PDFParser::GetPagesCount((PDFParser *)local_1d78);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar6);
                  std::operator<<(poVar7,"\n");
                  pdfWriter.mModifiedFileVersion = ~ePDFVersionUndefined;
                  textOptions.opacity._4_4_ = 2;
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,"unable to parse input file");
                textOptions.opacity._4_4_ = 2;
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,
                              "unable to open file RotatedPagesCopy.pdf for reading.\n");
              textOptions.opacity._4_4_ = 2;
            }
            PDFParser::~PDFParser((PDFParser *)local_1d78);
            InputFile::~InputFile((InputFile *)&pdfParser.mAllowExtendingSegments);
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed in end RotatedPagesCopy.pdf\n");
            textOptions.opacity._4_4_ = 2;
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to append pages from RotatedPages.pdf\n");
          pdfWriter.mModifiedFileVersion = local_1650._0_4_;
          textOptions.opacity._4_4_ = 2;
        }
        std::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::~pair((pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                 *)local_1650);
      }
      else {
        std::operator<<((ostream *)&std::cout,"failed to start RotatedPagesCopy.pdf\n");
        textOptions.opacity._4_4_ = 2;
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"failed in end RotatedPages.pdf\n");
      textOptions.opacity._4_4_ = 2;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start RotatedPages.pdf\n");
    textOptions.opacity._4_4_ = 2;
  }
  PDFWriter::~PDFWriter((PDFWriter *)local_f50);
  bVar9 = pdfWriter.mModifiedFileVersion != ePDFVersionUndefined;
  textOptions.opacity._4_4_ = 1;
  LogConfiguration::~LogConfiguration((LogConfiguration *)local_48);
  return (uint)bVar9;
}

Assistant:

int RotatedPagesPDF(int argc, char* argv[])
{
	LogConfiguration logConfiguration(true,true,BuildRelativeOutputPath(argv,"RotatedPagesLog.txt"));
	EStatusCode status; 

	do
	{
		// PDF Page rotation writing

		PDFWriter pdfWriter;
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			ePDFVersion13,logConfiguration);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPages.pdf\n";
			break;
		}	

		AbstractContentContext::TextOptions textOptions(pdfWriter.GetFontForFile(
																			BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf")),
																			14,
																			AbstractContentContext::eGray,
																			0);

		for(int i=0;i<6 && PDFHummus::eSuccess == status;++i)
		{
			PDFPage page;
			page.SetMediaBox(PDFRectangle(0,0,595,842));

			cout << "Setting invalid rotation to 33\n";
			page.SetRotate(33);
			if ( page.GetRotate().second != 0 )
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to reject invalid rotation\n";
				break;
			}
			cout << "success in failing to apply invalid rotation\n";

			page.SetRotate(i*90);
		
			std::ostringstream s;
			s << "Page rotated by " << i*90 << " degrees.";

			PageContentContext* cxt = pdfWriter.StartPageContentContext(&page);
			cxt->WriteText(75,805,s.str(),textOptions);
			status = pdfWriter.EndPageContentContext(cxt);
			if(status != eSuccess)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to end content context\n";
				break;
			}

			status = pdfWriter.WritePage(&page);
			if(status != PDFHummus::eSuccess)
				cout<<"failed to write page "<<i<<"\n";
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPages.pdf\n";
			break;
		}


		// PDF page rotation copy
        
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"),
			ePDFVersion13);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPagesCopy.pdf\n";
			break;
		}
        
		EStatusCodeAndObjectIDTypeList result;
        
        // append pages
		result = pdfWriter.AppendPDFPagesFromPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			PDFPageRange());

		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to append pages from RotatedPages.pdf\n";
			status = result.first;
			break;
		}
        
		status = pdfWriter.EndPDF();

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPagesCopy.pdf\n";
			break;
		}

		// PDF Page rotation parsing

		InputFile pdfFile;
		PDFParser pdfParser;

		status = pdfFile.OpenFile(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"));

		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to open file RotatedPagesCopy.pdf for reading.\n";
			break;
		}

		status = pdfParser.StartPDFParsing(pdfFile.GetInputStream());
		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to parse input file";
			break;
		}

		if(pdfParser.GetPagesCount() != 6)
		{
			cout<<"expecting 6 pages, got "<<pdfParser.GetPagesCount()<<"\n";
			status = PDFHummus::eFailure;
			break;
		}

		for(unsigned long i=0;i<pdfParser.GetPagesCount() && PDFHummus::eSuccess == status;++i)
		{
			RefCountPtr<PDFDictionary> page = pdfParser.ParsePage(i);
			if (!page)
			{
				cout << i << ". page parsing failed\n";
				status = PDFHummus::eFailure;
				break;
			}

			PDFPageInput input( &pdfParser, page );
			if ( input.GetRotate() != i*90 )
			{
				cout<< i << ". page has invalid rotation\n";
				status = PDFHummus::eFailure;
				break;
			}
		}

	}while(false);
	return status == eSuccess ? 0:1;
}